

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

ON_2dex ON_SubDQuadNeighborhood::CenterVertexDex(int vi)

{
  ON_2dex OStack_10;
  int vi_local;
  
  if (vi == 0) {
    ON_2dex::ON_2dex(&stack0xfffffffffffffff0,1,1);
  }
  else if (vi == 1) {
    ON_2dex::ON_2dex(&stack0xfffffffffffffff0,2,1);
  }
  else if (vi == 2) {
    ON_2dex::ON_2dex(&stack0xfffffffffffffff0,2,2);
  }
  else if (vi == 3) {
    ON_2dex::ON_2dex(&stack0xfffffffffffffff0,1,2);
  }
  else {
    ON_2dex::ON_2dex(&stack0xfffffffffffffff0,-0x7fffffff,-0x7fffffff);
  }
  return OStack_10;
}

Assistant:

const ON_2dex ON_SubDQuadNeighborhood::CenterVertexDex(
  int vi
)
{
  if (0 == vi)
    return ON_2dex(1, 1);
  if (1==vi)
    return ON_2dex(2, 1);
  if (2==vi)
    return ON_2dex(2, 2);
  if (3==vi)
    return ON_2dex(1, 2);
  return ON_2dex(ON_UNSET_INT_INDEX,ON_UNSET_INT_INDEX);
}